

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

bool __thiscall
caffe::NetParameter::MergePartialFromCodedStream(NetParameter *this,CodedInputStream *input)

{
  uint32 tag_00;
  bool bVar1;
  int iVar2;
  WireType WVar3;
  pair<unsigned_int,_bool> pVar4;
  V1LayerParameter *value;
  string *psVar5;
  char *pcVar6;
  RepeatedField<int> *pRVar7;
  NetState *value_00;
  BlobShape *value_01;
  LayerParameter *value_02;
  UnknownFieldSet *unknown_fields;
  bool local_8a;
  bool local_89;
  pair<unsigned_int,_bool> p;
  uint32 tag;
  CodedInputStream *input_local;
  NetParameter *this_local;
  bool local_3d;
  uint32 local_3c;
  bool local_35;
  uint32 tag_1;
  undefined4 uStack_30;
  bool at_or_below_cutoff;
  uint32 tag_3;
  uint32 kMax2ByteVarint;
  undefined4 local_24;
  uint32 tag_2;
  uint32 kMax1ByteVarint;
  uint32 first_byte_or_zero;
  uint32 local_10;
  uint uStack_c;
  
LAB_0075c13b:
  do {
    kMax1ByteVarint = 0x3fff;
    tag_2 = 0;
    _first_byte_or_zero = input;
    if (input->buffer_ < input->buffer_end_) {
      tag_2 = (uint32)*input->buffer_;
      if ((char)*input->buffer_ < '\x01') {
        if ((input->buffer_end_ <= input->buffer_ + 1) ||
           ((*input->buffer_ & (input->buffer_[1] ^ 0xff)) < 0x80)) goto LAB_0075c2ba;
        uStack_30 = 0x3fff;
        tag_1 = (uint)input->buffer_[1] * 0x80 + (*input->buffer_ - 0x80);
        google::protobuf::io::CodedInputStream::Advance(input,2);
        local_8a = 0x3ffe < kMax1ByteVarint || tag_1 <= kMax1ByteVarint;
        local_35 = local_8a;
        pVar4 = std::make_pair<unsigned_int&,bool&>(&tag_1,&local_35);
        local_10 = pVar4.first;
        uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
      }
      else {
        local_24 = 0x7f;
        kMax2ByteVarint = (uint32)*input->buffer_;
        google::protobuf::io::CodedInputStream::Advance(input,1);
        local_89 = 0x7e < kMax1ByteVarint || kMax2ByteVarint <= kMax1ByteVarint;
        tag_3._3_1_ = local_89;
        pVar4 = std::make_pair<unsigned_int&,bool>(&kMax2ByteVarint,(bool *)((long)&tag_3 + 3));
        local_10 = pVar4.first;
        uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
      }
    }
    else {
LAB_0075c2ba:
      local_3c = google::protobuf::io::CodedInputStream::ReadTagFallback(input,tag_2);
      local_3d = local_3c - 1 < kMax1ByteVarint;
      pVar4 = std::make_pair<unsigned_int_const&,bool>(&local_3c,&local_3d);
      local_10 = pVar4.first;
      uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
    }
    tag_00 = local_10;
    if ((uStack_c & 1) == 0) {
LAB_0075c719:
      if ((tag_00 == 0) ||
         (WVar3 = google::protobuf::internal::WireFormatLite::GetTagWireType(tag_00),
         WVar3 == WIRETYPE_END_GROUP)) {
        return true;
      }
      unknown_fields = mutable_unknown_fields(this);
      bVar1 = google::protobuf::internal::WireFormat::SkipField(input,tag_00,unknown_fields);
    }
    else {
      iVar2 = google::protobuf::internal::WireFormatLite::GetTagFieldNumber(local_10);
      if (iVar2 == 1) {
        if ((tag_00 & 0xff) != 10) goto LAB_0075c719;
        psVar5 = mutable_name_abi_cxx11_(this);
        bVar1 = google::protobuf::internal::WireFormatLite::ReadString(input,psVar5);
        if (!bVar1) {
          return false;
        }
        name_abi_cxx11_(this);
        pcVar6 = (char *)std::__cxx11::string::data();
        name_abi_cxx11_(this);
        iVar2 = std::__cxx11::string::length();
        google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
                  (pcVar6,iVar2,PARSE,"caffe.NetParameter.name");
        goto LAB_0075c13b;
      }
      if (iVar2 == 2) {
        if ((tag_00 & 0xff) == 0x12) {
          value = add_layers(this);
          bVar1 = google::protobuf::internal::WireFormatLite::
                  ReadMessageNoVirtual<caffe::V1LayerParameter>(input,value);
          goto joined_r0x0075c70d;
        }
        goto LAB_0075c719;
      }
      if (iVar2 == 3) {
        if ((tag_00 & 0xff) != 0x1a) goto LAB_0075c719;
        psVar5 = add_input_abi_cxx11_(this);
        bVar1 = google::protobuf::internal::WireFormatLite::ReadString(input,psVar5);
        if (!bVar1) {
          return false;
        }
        iVar2 = input_size(this);
        input_abi_cxx11_(this,iVar2 + -1);
        pcVar6 = (char *)std::__cxx11::string::data();
        iVar2 = input_size(this);
        input_abi_cxx11_(this,iVar2 + -1);
        iVar2 = std::__cxx11::string::length();
        google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
                  (pcVar6,iVar2,PARSE,"caffe.NetParameter.input");
        goto LAB_0075c13b;
      }
      if (iVar2 == 4) {
        if ((tag_00 & 0xff) == 0x20) {
          pRVar7 = mutable_input_dim(this);
          bVar1 = google::protobuf::internal::WireFormatLite::
                  ReadRepeatedPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                            (1,0x20,input,pRVar7);
        }
        else {
          if ((tag_00 & 0xff) != 0x22) goto LAB_0075c719;
          pRVar7 = mutable_input_dim(this);
          bVar1 = google::protobuf::internal::WireFormatLite::
                  ReadPackedPrimitiveNoInline<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                            (input,pRVar7);
        }
      }
      else if (iVar2 == 5) {
        if ((tag_00 & 0xff) != 0x28) goto LAB_0075c719;
        set_has_force_backward(this);
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                          (input,&this->force_backward_);
      }
      else if (iVar2 == 6) {
        if ((tag_00 & 0xff) != 0x32) goto LAB_0075c719;
        value_00 = mutable_state(this);
        bVar1 = google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual<caffe::NetState>
                          (input,value_00);
      }
      else if (iVar2 == 7) {
        if ((tag_00 & 0xff) != 0x38) goto LAB_0075c719;
        set_has_debug_info(this);
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                          (input,&this->debug_info_);
      }
      else if (iVar2 == 8) {
        if ((tag_00 & 0xff) != 0x42) goto LAB_0075c719;
        value_01 = add_input_shape(this);
        bVar1 = google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual<caffe::BlobShape>
                          (input,value_01);
      }
      else {
        if ((iVar2 != 100) || ((tag_00 & 0xff) != 0x22)) goto LAB_0075c719;
        value_02 = add_layer(this);
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<caffe::LayerParameter>(input,value_02);
      }
    }
joined_r0x0075c70d:
    if (!bVar1) {
      return false;
    }
  } while( true );
}

Assistant:

bool NetParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.NetParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string name = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.NetParameter.name");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .caffe.V1LayerParameter layers = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_layers()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated string input = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->add_input()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->input(this->input_size() - 1).data(),
            this->input(this->input_size() - 1).length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.NetParameter.input");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated int32 input_dim = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(32u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 1, 32u, input, this->mutable_input_dim())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(34u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitiveNoInline<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, this->mutable_input_dim())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool force_backward = 5 [default = false];
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(40u)) {
          set_has_force_backward();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &force_backward_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.NetState state = 6;
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(50u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_state()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool debug_info = 7 [default = false];
      case 7: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(56u)) {
          set_has_debug_info();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &debug_info_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .caffe.BlobShape input_shape = 8;
      case 8: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(66u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_input_shape()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .caffe.LayerParameter layer = 100;
      case 100: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(802u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_layer()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.NetParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.NetParameter)
  return false;
#undef DO_
}